

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 HashmapCmpCallback1(jx9_hashmap_node *pA,jx9_hashmap_node *pB,void *pCmpData)

{
  sxi32 sVar1;
  int iNest;
  anon_union_8_3_18420de5_for_x local_a8;
  ulong uStack_a0;
  jx9_vm *local_98;
  jx9_vm *pjStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  anon_union_8_3_18420de5_for_x local_68;
  ulong uStack_60;
  jx9_vm *local_58;
  jx9_vm *pjStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  if (pCmpData != (void *)0x0) {
    local_98 = pA->pMap->pVm;
    local_68.rVal = 0.0;
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 0;
    uStack_40 = 0;
    uStack_60 = 0x20;
    local_a8.rVal = 0.0;
    local_88 = 0;
    uStack_80 = 0;
    local_78 = 0;
    uStack_70 = 0;
    uStack_a0 = 0x20;
    pjStack_90 = local_98;
    local_58 = local_98;
    pjStack_50 = local_98;
    jx9HashmapExtractNodeValue
              ((jx9_hashmap_node *)local_98,(jx9_value *)(ulong)pA->nValIdx,(int)&local_68);
    iNest = 0;
    jx9HashmapExtractNodeValue
              ((jx9_hashmap_node *)pB->pMap->pVm,(jx9_value *)(ulong)pB->nValIdx,(int)&local_a8);
    if ((int)pCmpData == 5) {
      if ((uStack_60 & 1) == 0) {
        jx9MemObjToString((jx9_value *)&local_68);
      }
      if ((uStack_a0 & 1) == 0) {
        jx9MemObjToString((jx9_value *)&local_a8);
      }
    }
    else {
      jx9MemObjToNumeric((jx9_value *)&local_68);
      jx9MemObjToNumeric((jx9_value *)&local_a8);
    }
    sVar1 = jx9MemObjCmp((jx9_value *)&local_68,(jx9_value *)&local_a8,0,iNest);
    jx9MemObjRelease((jx9_value *)&local_68);
    jx9MemObjRelease((jx9_value *)&local_a8);
    return sVar1;
  }
  sVar1 = HashmapNodeCmp(pA,pB,0);
  return sVar1;
}

Assistant:

static sxi32 HashmapCmpCallback1(jx9_hashmap_node *pA, jx9_hashmap_node *pB, void *pCmpData)
{
	jx9_value sA, sB;
	sxi32 iFlags;
	int rc;
	if( pCmpData == 0 ){
		/* Perform a standard comparison */
		rc = HashmapNodeCmp(pA, pB, FALSE);
		return rc;
	}
	iFlags = SX_PTR_TO_INT(pCmpData);
	/* Duplicate node values */
	jx9MemObjInit(pA->pMap->pVm, &sA);
	jx9MemObjInit(pA->pMap->pVm, &sB);
	jx9HashmapExtractNodeValue(pA, &sA, FALSE);
	jx9HashmapExtractNodeValue(pB, &sB, FALSE);
	if( iFlags == 5 ){
		/* String cast */
		if( (sA.iFlags & MEMOBJ_STRING) == 0 ){
			jx9MemObjToString(&sA);
		}
		if( (sB.iFlags & MEMOBJ_STRING) == 0 ){
			jx9MemObjToString(&sB);
		}
	}else{
		/* Numeric cast */
		jx9MemObjToNumeric(&sA);
		jx9MemObjToNumeric(&sB);
	}
	/* Perform the comparison */
	rc = jx9MemObjCmp(&sA, &sB, FALSE, 0);
	jx9MemObjRelease(&sA);
	jx9MemObjRelease(&sB);
	return rc;
}